

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cc
# Opt level: O2

string * __thiscall
serial::Serial::SerialImpl::getPort_abi_cxx11_(string *__return_storage_ptr__,SerialImpl *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->port_);
  return __return_storage_ptr__;
}

Assistant:

string
Serial::SerialImpl::getPort () const
{
  return port_;
}